

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O1

QRect __thiscall QWidgetItem::geometry(QWidgetItem *this)

{
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  long lVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QRect QVar7;
  
  bVar4 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
  pQVar1 = this->wid;
  if (bVar4) {
    pQVar2 = pQVar1->data;
    uVar5._0_4_ = (pQVar2->crect).x1;
    uVar5._4_4_ = (pQVar2->crect).y1;
    uVar6._0_4_ = (pQVar2->crect).x2;
    uVar6._4_4_ = (pQVar2->crect).y2;
  }
  else {
    lVar3 = *(long *)&pQVar1->field_0x8;
    pQVar2 = pQVar1->data;
    uVar5 = CONCAT44((pQVar2->crect).y1.m_i - (int)*(char *)(lVar3 + 0x1a1),
                     (pQVar2->crect).x1.m_i - (int)*(char *)(lVar3 + 0x1a0));
    uVar6 = CONCAT44((int)*(char *)(lVar3 + 0x1a3) + (pQVar2->crect).y2.m_i,
                     (int)*(char *)(lVar3 + 0x1a2) + (pQVar2->crect).x2.m_i);
  }
  QVar7.x2.m_i = (int)uVar6;
  QVar7.y2.m_i = (int)((ulong)uVar6 >> 0x20);
  QVar7.x1.m_i = (int)uVar5;
  QVar7.y1.m_i = (int)((ulong)uVar5 >> 0x20);
  return QVar7;
}

Assistant:

QRect QWidgetItem::geometry() const
{
    return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
           ? toLayoutItemRect(wid->d_func(), wid->geometry())
           : wid->geometry();
}